

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  double dStack_58;
  double base [2];
  undefined1 local_40 [8];
  QuantumComputer qc;
  
  dStack_58 = 0.0;
  base[0] = 1.0;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  quantum::QuantumComputer::QuantumComputer((QuantumComputer *)local_40,1,&dStack_58,2);
  quantum::QuantumComputer::resetState((QuantumComputer *)local_40);
  quantum::QuantumComputer::setValueInRegister((QuantumComputer *)local_40,0,0.7071067811865475);
  quantum::QuantumComputer::setValueInRegister((QuantumComputer *)local_40,1,0.7071067811865475);
  quantum::QuantumComputer::viewProbabilityForBaseVector((QuantumComputer *)local_40);
  if (qc._8_8_ != 0) {
    operator_delete((void *)qc._8_8_,
                    (long)qc.baseVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - qc._8_8_);
  }
  return 0;
}

Assistant:

int main() {

    int numberOfQubits = 1;
    double base[] = {0.0, 1.0};
    auto arrSize = std::size(base);
    std::cout<<arrSize<<std::endl;
    struct QuantumComputer qc =
            QuantumComputer(numberOfQubits, base, arrSize);
    qc.resetState();
    qc.setValueInRegister(0, 1 / (sqrt(2)));
    qc.setValueInRegister(1, 1 / (sqrt(2)));
    qc.viewProbabilityForBaseVector();

    return 0;
}